

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O1

bool __thiscall cs::domain_manager::exist_record_in_struct(domain_manager *this,string *name)

{
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *prVar1;
  size_t sVar2;
  size_t sVar3;
  byte unaff_BPL;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_00;
  key_arg<std::__cxx11::basic_string<char>_> local_50;
  
  prVar1 = (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            *)(this->m_set).m_start;
  this_00 = (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
             *)(this->m_set).m_current;
  do {
    if (this_00 == prVar1) {
      unaff_BPL = 0;
      break;
    }
    this_00 = this_00 + -0x30;
    sVar2 = phmap::priv::
            raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::count<std::__cxx11::string>(this_00,name);
    if (sVar2 != 0) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"__PRAGMA_CS_STRUCT_DEFINITION__","");
      sVar3 = phmap::priv::
              raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::count<std::__cxx11::string>(this_00,&local_50);
      unaff_BPL = sVar3 != 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  } while (sVar2 == 0);
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool exist_record_in_struct(const string &name)
		{
			for (auto &set: m_set) {
				if (set.count(name) > 0)
					return set.count("__PRAGMA_CS_STRUCT_DEFINITION__") > 0;
			}
			return false;
		}